

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psac.cpp
# Opt level: O0

bool check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
               (suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                *sa,string *str,comm *c)

{
  bool bVar1;
  int iVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  bool local_39;
  undefined1 local_38 [7];
  bool dss_correct;
  vector<unsigned_long,_std::allocator<unsigned_long>_> gsa;
  comm *c_local;
  string *str_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  *sa_local;
  
  gsa.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)c;
  mxx::gatherv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,&sa->local_SA,0,c);
  local_39 = true;
  iVar2 = mxx::comm::rank((comm *)gsa.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar2 == 0) {
    begin._M_current = (char *)std::__cxx11::string::begin();
    end._M_current = (char *)std::__cxx11::string::end();
    local_39 = dss::
               check<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long>
                         (begin,end,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  }
  bVar1 = mxx::all_of(local_39,(comm *)gsa.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  return bVar1;
}

Assistant:

bool check_sa_dss(suffix_array<Iterator, index_t, _LCP>& sa, const std::string& str, const mxx::comm& c) {
    // gather SA back to root process
    std::vector<index_t> gsa = mxx::gatherv(sa.local_SA, 0, c);

    // check correctness using dss
    bool dss_correct = true;
    if (c.rank() == 0) {
        dss_correct = dss::check(str.begin(), str.end(), gsa);
    }

    return mxx::all_of(dss_correct, c);

    // check correctness using own method
    // TODO return bool value instead of exit(FAILURE) in that function
    //bool correct = gl_check_correct(sa, local_str.begin(), local_str.end(), c);
}